

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

double __thiscall Graph::evaluateLossesAndFlows(Graph *this,double tol,int idLoadFactorGlobal)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  int it;
  int it_00;
  double dVar4;
  
  resetFlowAndLoss(this);
  Vertex::idLF = idLoadFactorGlobal;
  pdVar2 = getLosses(this);
  it_00 = 0;
  for (dVar4 = 1.0; tol < dVar4; dVar4 = dVar4 - dVar1) {
    forward(this,it_00);
    backward(this);
    pdVar3 = getLosses(this);
    dVar4 = *pdVar3;
    dVar1 = *pdVar2;
    operator_delete(pdVar2,8);
    it_00 = it_00 + 1;
    pdVar2 = pdVar3;
  }
  pdVar2 = getLosses(this);
  return *pdVar2;
}

Assistant:

double Graph::evaluateLossesAndFlows(double tol, int idLoadFactorGlobal){
    this->resetFlowAndLoss();
    Vertex::idLF = idLoadFactorGlobal; /// Static Param. Muda rede toda

    double *last_total_loss, *current_total_loss , error = 1.0;

    last_total_loss = this->getLosses();
    for( int it = 0; error>tol; it++ ){
        forward(it);        // Calcula fluxos de potencia nas linhas
        backward();         // Calcula voltagem nas barras e perdas nas linhas

        current_total_loss = this->getLosses();
        error = current_total_loss[0] - last_total_loss[0];
        delete last_total_loss;

        last_total_loss = current_total_loss;
    }
    return this->getLosses()[0];
}